

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  wchar_t *in_RDX;
  string local_38;
  
  internal::String::ShowWideCString_abi_cxx11_(&local_38,(String *)wide_c_str,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &((this->ss_)._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl)->field_0x10,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Message& Message::operator <<(wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}